

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void write_N(ofstream *fout_N)

{
  pointer psVar1;
  ostream *poVar2;
  ostream *in_RDI;
  double N_ph;
  double N_p;
  double N_e;
  double local_20;
  double local_18;
  double local_10;
  ostream *local_8;
  
  local_8 = in_RDI;
  psVar1 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x138425);
  MPI_Reduce(&psVar1->N_e,&local_10,1,&ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  psVar1 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x138466);
  MPI_Reduce(&psVar1->N_p,&local_18,1,&ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  psVar1 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x1384a7);
  MPI_Reduce(&psVar1->N_ph,&local_20,1,&ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  if (mpi_rank == 0) {
    poVar2 = (ostream *)std::ostream::operator<<(local_8,local_10);
    poVar2 = std::operator<<(poVar2,'\t');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,'\t');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void write_N(ofstream& fout_N)
{
    double N_e,N_p,N_ph;
    MPI_Reduce(&(psr->N_e), &N_e, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->N_p), &N_p, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->N_ph), &N_ph, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    if (mpi_rank == 0) {
        fout_N<<N_e<<'\t'<<N_p<<'\t'<<N_ph<<endl;
    }
}